

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::Hermite
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  long *plVar2;
  long row;
  double *pdVar3;
  long lVar4;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  int ord;
  long *col;
  TPZFMatrix<double> *in_stack_ffffffffffffff90;
  double local_58;
  double local_50;
  int local_44;
  undefined8 local_40;
  double local_38 [3];
  long *local_20;
  long *local_18;
  int local_c;
  double local_8;
  
  if (0 < in_EDI) {
    local_38[2] = 1.0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_c = in_EDI;
    local_8 = in_XMM0_Qa;
    (**(code **)(*in_RSI + 0x100))(in_RSI,0,0,local_38 + 2);
    local_38[1] = 0.0;
    (**(code **)(*local_20 + 0x100))(local_20,0,0,local_38 + 1);
    if (local_c != 1) {
      local_38[0] = local_8 * 2.0;
      (**(code **)(*local_18 + 0x100))(local_18,1,0,local_38);
      local_40 = 0x4000000000000000;
      (**(code **)(*local_20 + 0x100))(local_20,0,1,&local_40);
      for (local_44 = 2; local_44 < local_c; local_44 = local_44 + 1) {
        row = (long)local_44;
        dVar5 = local_8 * 2.0;
        col = local_18;
        pdVar3 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff90,row,(int64_t)local_18);
        dVar1 = *pdVar3;
        dVar6 = (double)local_44;
        pdVar3 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff90,row,(int64_t)col);
        local_50 = dVar5 * dVar1 + -((dVar6 + dVar6 + -1.0) * *pdVar3);
        (**(code **)(*col + 0x100))(col,row,0,&local_50);
        plVar2 = local_20;
        lVar4 = (long)local_44;
        in_stack_ffffffffffffff90 =
             (TPZFMatrix<double> *)((double)local_44 + (double)local_44 + -1.0);
        pdVar3 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff90,row,(int64_t)col);
        local_58 = (double)in_stack_ffffffffffffff90 * *pdVar3;
        (**(code **)(*plVar2 + 0x100))(plVar2,0,lVar4,&local_58);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Hermite(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		// Quadratic or higher shape functions (for physicists)
		if(num <= 0) return;
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, 2.0*x);
		dphi.Put(0,1, 2.0);
        // Following http://mathworld.wolfram.com/HermitePolynomial.html
		for(int ord = 2;ord<num;ord++) {
			phi.Put(ord,0, 2.0*x*phi(ord-1,0) - (2.0*(REAL)ord-1.0)*phi(ord-2,0));
			dphi.Put(0,ord, (2.0*(REAL)ord-1.0)*phi(ord-2,0));
		}
	}